

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O2

bool ON_TransformPointList(int dim,bool is_rat,int count,int stride,float *point,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  bool bVar11;
  float *pfVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  if ((dim < 1) || ((point == (float *)0x0 || count < 0) || stride < (int)((uint)is_rat + dim))) {
    bVar11 = false;
  }
  else {
    bVar11 = true;
    if (count != 0) {
      if (is_rat) {
        dVar1 = xform->m_xform[0][0];
        if (dim == 1) {
          dVar4 = xform->m_xform[0][3];
          dVar2 = xform->m_xform[3][0];
          dVar3 = xform->m_xform[3][3];
          while (bVar13 = count != 0, count = count + -1, bVar13) {
            *(ulong *)point =
                 CONCAT44((float)((double)*point * dVar2 + (double)point[1] * dVar3),
                          (float)((double)*point * dVar1 + (double)point[1] * dVar4));
            point = point + (uint)stride;
          }
        }
        else if (dim == 2) {
          dVar6 = xform->m_xform[0][1];
          dVar7 = xform->m_xform[0][3];
          dVar2 = xform->m_xform[3][0];
          dVar3 = xform->m_xform[3][1];
          dVar4 = xform->m_xform[3][3];
          dVar17 = xform->m_xform[1][3];
          dVar19 = xform->m_xform[1][0];
          dVar5 = xform->m_xform[1][1];
          pfVar12 = point + 2;
          while (bVar13 = count != 0, count = count + -1, bVar13) {
            dVar15 = (double)pfVar12[-2];
            dVar16 = (double)pfVar12[-1];
            dVar18 = (double)*pfVar12;
            *(ulong *)(pfVar12 + -2) =
                 CONCAT44((float)(dVar18 * dVar17 + dVar15 * dVar19 + dVar16 * dVar5),
                          (float)(dVar18 * dVar7 + dVar15 * dVar1 + dVar16 * dVar6));
            *pfVar12 = (float)(dVar4 * dVar18 + dVar2 * dVar15 + dVar3 * dVar16);
            pfVar12 = pfVar12 + (uint)stride;
          }
        }
        else {
          dVar8 = xform->m_xform[0][1];
          dVar9 = xform->m_xform[0][2];
          dVar10 = xform->m_xform[0][3];
          dVar2 = xform->m_xform[2][0];
          dVar3 = xform->m_xform[2][1];
          dVar4 = xform->m_xform[2][2];
          dVar17 = xform->m_xform[2][3];
          dVar19 = xform->m_xform[3][0];
          dVar5 = xform->m_xform[3][1];
          dVar6 = xform->m_xform[3][2];
          dVar7 = xform->m_xform[3][3];
          dVar15 = xform->m_xform[1][3];
          dVar16 = xform->m_xform[1][2];
          dVar18 = xform->m_xform[1][0];
          dVar20 = xform->m_xform[1][1];
          while (bVar13 = count != 0, count = count + -1, bVar13) {
            dVar23 = (double)*point;
            dVar14 = (double)point[1];
            dVar21 = (double)point[2];
            dVar22 = (double)point[(uint)dim];
            *(ulong *)point =
                 CONCAT44((float)(dVar22 * dVar15 +
                                 dVar21 * dVar16 + dVar23 * dVar18 + dVar14 * dVar20),
                          (float)(dVar22 * dVar10 + dVar21 * dVar9 + dVar23 * dVar1 + dVar14 * dVar8
                                 ));
            point[2] = (float)(dVar17 * dVar22 + dVar4 * dVar21 + dVar2 * dVar23 + dVar3 * dVar14);
            point[(uint)dim] =
                 (float)(dVar7 * dVar22 + dVar6 * dVar21 + dVar19 * dVar23 + dVar5 * dVar14);
            point = point + (uint)stride;
          }
        }
      }
      else {
        dVar1 = xform->m_xform[3][0];
        if (dim == 1) {
          dVar2 = xform->m_xform[3][3];
          dVar3 = xform->m_xform[0][0];
          dVar4 = xform->m_xform[0][3];
          bVar11 = true;
          while (bVar13 = count != 0, count = count + -1, bVar13) {
            dVar19 = dVar1 * (double)*point + dVar2;
            dVar17 = 1.0 / dVar19;
            if ((dVar19 == 0.0) && (!NAN(dVar19))) {
              dVar17 = 1.0;
            }
            bVar11 = (bool)(bVar11 & dVar19 != 0.0);
            *point = (float)(((double)*point * dVar3 + dVar4) * dVar17);
            point = point + (uint)stride;
          }
        }
        else if (dim == 2) {
          dVar2 = xform->m_xform[3][1];
          dVar3 = xform->m_xform[3][3];
          dVar5 = xform->m_xform[0][0];
          dVar6 = xform->m_xform[0][1];
          dVar7 = xform->m_xform[0][3];
          dVar4 = xform->m_xform[1][3];
          dVar17 = xform->m_xform[1][0];
          dVar19 = xform->m_xform[1][1];
          bVar11 = true;
          while (bVar13 = count != 0, count = count + -1, bVar13) {
            dVar15 = (double)*point;
            dVar16 = (double)point[1];
            dVar20 = dVar1 * dVar15 + dVar2 * dVar16 + dVar3;
            dVar18 = 1.0 / dVar20;
            if ((dVar20 == 0.0) && (!NAN(dVar20))) {
              dVar18 = 1.0;
            }
            bVar11 = (bool)(bVar11 & dVar20 != 0.0);
            *(ulong *)point =
                 CONCAT44((float)(dVar18 * (dVar15 * dVar17 + dVar16 * dVar19 + dVar4)),
                          (float)(dVar18 * (dVar15 * dVar5 + dVar16 * dVar6 + dVar7)));
            point = point + (uint)stride;
          }
        }
        else {
          dVar2 = xform->m_xform[3][1];
          dVar3 = xform->m_xform[3][2];
          dVar4 = xform->m_xform[3][3];
          dVar20 = xform->m_xform[0][0];
          dVar8 = xform->m_xform[0][1];
          dVar9 = xform->m_xform[0][2];
          dVar10 = xform->m_xform[0][3];
          dVar17 = xform->m_xform[2][0];
          dVar19 = xform->m_xform[2][1];
          dVar5 = xform->m_xform[2][2];
          dVar6 = xform->m_xform[2][3];
          dVar7 = xform->m_xform[1][3];
          dVar15 = xform->m_xform[1][2];
          dVar16 = xform->m_xform[1][0];
          dVar18 = xform->m_xform[1][1];
          pfVar12 = point + 2;
          bVar11 = true;
          while (bVar13 = count != 0, count = count + -1, bVar13) {
            dVar23 = (double)pfVar12[-2];
            dVar21 = (double)pfVar12[-1];
            dVar24 = (double)*pfVar12;
            dVar14 = dVar3 * dVar24 + dVar1 * dVar23 + dVar2 * dVar21 + dVar4;
            dVar22 = 1.0 / dVar14;
            if ((dVar14 == 0.0) && (!NAN(dVar14))) {
              dVar22 = 1.0;
            }
            bVar11 = (bool)(bVar11 & dVar14 != 0.0);
            *(ulong *)(pfVar12 + -2) =
                 CONCAT44((float)(dVar22 * (dVar24 * dVar15 + dVar23 * dVar16 + dVar21 * dVar18 +
                                           dVar7)),
                          (float)(dVar22 * (dVar24 * dVar9 + dVar23 * dVar20 + dVar21 * dVar8 +
                                           dVar10)));
            *pfVar12 = (float)((dVar5 * dVar24 + dVar17 * dVar23 + dVar19 * dVar21 + dVar6) * dVar22
                              );
            pfVar12 = pfVar12 + (uint)stride;
          }
        }
      }
    }
  }
  return bVar11;
}

Assistant:

bool 
ON_IsValidPointList(
       int dim,
       bool is_rat,
       int count,
       int stride,
       const float* p
       )
{
  return ( dim > 0 && stride >= (is_rat?(dim+1):dim) && count >= 0 && p != nullptr ) ? true : false;
}